

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O0

void __thiscall efsw::FileWatcherGeneric::~FileWatcherGeneric(FileWatcherGeneric *this)

{
  bool bVar1;
  reference ppWVar2;
  __normal_iterator<efsw::WatcherGeneric_**,_std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>_>
  local_20;
  __normal_iterator<efsw::WatcherGeneric_**,_std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>_>
  local_18;
  iterator it;
  FileWatcherGeneric *this_local;
  
  (this->super_FileWatcherImpl)._vptr_FileWatcherImpl =
       (_func_int **)&PTR__FileWatcherGeneric_00184a00;
  it._M_current = (WatcherGeneric **)this;
  Atomic<bool>::operator=(&(this->super_FileWatcherImpl).mInitOK,false);
  if (this->mThread != (Thread *)0x0) {
    if (this->mThread != (Thread *)0x0) {
      (*this->mThread->_vptr_Thread[1])();
    }
    this->mThread = (Thread *)0x0;
  }
  local_18._M_current =
       (WatcherGeneric **)
       std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::begin
                 (&this->mWatches);
  while( true ) {
    local_20._M_current =
         (WatcherGeneric **)
         std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::end
                   (&this->mWatches);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppWVar2 = __gnu_cxx::
              __normal_iterator<efsw::WatcherGeneric_**,_std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>_>
              ::operator*(&local_18);
    if (*ppWVar2 != (WatcherGeneric *)0x0) {
      ppWVar2 = __gnu_cxx::
                __normal_iterator<efsw::WatcherGeneric_**,_std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>_>
                ::operator*(&local_18);
      if (*ppWVar2 != (WatcherGeneric *)0x0) {
        (*((*ppWVar2)->super_Watcher)._vptr_Watcher[1])();
      }
      ppWVar2 = __gnu_cxx::
                __normal_iterator<efsw::WatcherGeneric_**,_std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>_>
                ::operator*(&local_18);
      *ppWVar2 = (WatcherGeneric *)0x0;
    }
    __gnu_cxx::
    __normal_iterator<efsw::WatcherGeneric_**,_std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>_>
    ::operator++(&local_18);
  }
  Mutex::~Mutex(&this->mWatchesLock);
  std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::~vector
            (&this->mWatches);
  FileWatcherImpl::~FileWatcherImpl(&this->super_FileWatcherImpl);
  return;
}

Assistant:

FileWatcherGeneric::~FileWatcherGeneric() {
	mInitOK = false;

	efSAFE_DELETE( mThread );

	/// Delete the watches
	WatchList::iterator it = mWatches.begin();

	for ( ; it != mWatches.end(); ++it ) {
		efSAFE_DELETE( ( *it ) );
	}
}